

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall CGL::AppConfig::~AppConfig(AppConfig *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->ghost_aperture_filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ghost_aperture_filename).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->aperture_filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->aperture_filename).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->pathtracer_filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->pathtracer_filename).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

AppConfig () {

    pathtracer_ns_aa = 1;
    pathtracer_max_ray_depth = 1;
    pathtracer_ns_area_light = 1;

    pathtracer_ns_diff = 1;
    pathtracer_ns_glsy = 1;
    pathtracer_ns_refr = 1;

    pathtracer_num_threads = 1;
    pathtracer_envmap = NULL;

    pathtracer_samples_per_patch = 32;
    pathtracer_max_tolerance = 0.05f;
    pathtracer_direct_hemisphere_sample = false;

    pathtracer_filename = "";
    pathtracer_lensRadius = 0.0;
    pathtracer_focalDistance = 4.7;

    // Begin Lens Flare implementation
    aperture_filename = "";
    pathtracer_lens_flare_radius = 25.0;
    pathtracer_lens_flare_intensity = 1;
		ghost_aperture_filename = "";
  }